

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  byte *pbVar1;
  size_t *psVar2;
  Input *pIVar3;
  char *value;
  undefined2 *puVar4;
  WirePointer *pWVar5;
  double dVar6;
  StructBuilder other;
  StructBuilder other_00;
  Orphan<capnp::json::Value::Field> *pOVar7;
  RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *pRVar8;
  Orphan<capnp::json::Value::Field> *pOVar9;
  SegmentBuilder *pSVar10;
  byte bVar11;
  bool bVar12;
  char cVar13;
  BuilderArena *pBVar14;
  ulong uVar15;
  CapTableBuilder *pCVar16;
  Exception *pEVar17;
  size_t sVar18;
  word wVar19;
  long lVar20;
  unsigned_long i;
  long lVar21;
  long lVar22;
  Reader value_00;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> expected_01;
  Reader value_01;
  Vector<capnp::Orphan<capnp::json::Value::Field>_> fields;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint7 uStack_b7;
  SegmentBuilder *pSStack_b0;
  WirePointer *local_a8;
  WirePointer *pWStack_a0;
  undefined8 local_98;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_7f;
  PointerBuilder local_58;
  size_t *local_40;
  CapTableBuilder *local_38;
  
  this_00 = &this->input;
  Input::consumeWhitespace(this_00);
  if ((this->input).wrapped.size_ == 0) {
    __kjCondition = (ulong)uStack_b7 << 8;
  }
  else {
    pIVar3 = (Input *)(this->input).wrapped.ptr;
    _kjCondition.value = *(char *)&(pIVar3->wrapped).ptr != '\0';
    if (_kjCondition.value) {
      bVar11 = Input::nextChar(pIVar3);
      if (bVar11 < 0x5b) {
        if (9 < bVar11 - 0x30) {
          if (bVar11 == 0x22) {
            consumeQuotedString((String *)&_kjCondition,this);
            wVar19.content = __kjCondition;
            if (pSStack_b0 == (SegmentBuilder *)0x0) {
              wVar19.content = (uint64_t)(Exception *)0x229f1b;
            }
            value_01.super_StringPtr.content.size_ =
                 (long)&(pSStack_b0->super_SegmentReader).arena +
                 (ulong)(pSStack_b0 == (SegmentBuilder *)0x0);
            *(undefined2 *)(output->_builder).data = 3;
            f.exception = (Exception *)(output->_builder).segment;
            value_01.super_StringPtr.content.ptr = (char *)wVar19.content;
            capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f,value_01);
            wVar19.content = __kjCondition;
            if ((Exception *)__kjCondition != (Exception *)0x0) {
              __kjCondition = 0;
              (**(_func_int **)*local_a8)(local_a8,wVar19.content,1,pSStack_b0,pSStack_b0,0);
            }
            goto LAB_00173902;
          }
          if (bVar11 != 0x2d) goto LAB_001742a1;
        }
        value = (this_00->wrapped).ptr;
        Input::tryConsume(this_00,'-');
        bVar12 = Input::tryConsume(this_00,'0');
        if (!bVar12) {
          cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
          bVar12 = (byte)(cVar13 - 0x31U) < 9;
          _kjCondition_1.value = bVar12;
          if (!bVar12) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x25c,FAILED,"predicate(current)",
                       "_kjCondition,\"Unexpected input in JSON message.\"",&_kjCondition_1,
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          Input::advance(this_00,1);
          while ((((this->input).wrapped.size_ != 0 &&
                  (pIVar3 = (Input *)(this_00->wrapped).ptr, *(char *)&(pIVar3->wrapped).ptr != '\0'
                  )) && (cVar13 = Input::nextChar(pIVar3), (byte)(cVar13 - 0x30U) < 10))) {
            Input::advance(this_00,1);
          }
        }
        bVar12 = Input::tryConsume(this_00,'.');
        if (bVar12 && (this->input).wrapped.size_ != 0) {
          do {
            pIVar3 = (Input *)(this_00->wrapped).ptr;
            if ((*(char *)&(pIVar3->wrapped).ptr == '\0') ||
               (cVar13 = Input::nextChar(pIVar3), 9 < (byte)(cVar13 - 0x30U))) break;
            Input::advance(this_00,1);
          } while ((this->input).wrapped.size_ != 0);
        }
        bVar12 = Input::tryConsume(this_00,'e');
        if ((bVar12) || (bVar12 = Input::tryConsume(this_00,'E'), bVar12)) {
          bVar12 = Input::tryConsume(this_00,'+');
          if (!bVar12) {
            Input::tryConsume(this_00,'-');
          }
          while ((((this->input).wrapped.size_ != 0 &&
                  (pIVar3 = (Input *)(this_00->wrapped).ptr, *(char *)&(pIVar3->wrapped).ptr != '\0'
                  )) && (cVar13 = Input::nextChar(pIVar3), (byte)(cVar13 - 0x30U) < 10))) {
            Input::advance(this_00,1);
          }
        }
        f.exception = (Exception *)((this_00->wrapped).ptr + -(long)value);
        if (f.exception == (Exception *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                    ((Fault *)&_kjCondition_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x33d,FAILED,"numArrayPtr.size() > 0",
                     "_kjCondition,\"Expected number in JSON input.\"",
                     (DebugComparison<unsigned_long,_int> *)&f,
                     (char (*) [31])"Expected number in JSON input.");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
        }
        kj::heapString((String *)&_kjCondition,value,(size_t)f.exception);
        f.exception = (Exception *)__kjCondition;
        if (pSStack_b0 == (SegmentBuilder *)0x0) {
          f.exception = (Exception *)0x229f1b;
        }
        dVar6 = kj::StringPtr::parseAs<double>((StringPtr *)&f);
        wVar19.content = __kjCondition;
        puVar4 = (undefined2 *)(output->_builder).data;
        *puVar4 = 2;
        *(double *)(puVar4 + 4) = dVar6;
        if ((Exception *)__kjCondition != (Exception *)0x0) {
          __kjCondition = 0;
          (**(_func_int **)*local_a8)(local_a8,wVar19.content,1,pSStack_b0,pSStack_b0,0);
        }
      }
      else if (bVar11 < 0x6e) {
        if (bVar11 == 0x5b) {
          fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
          fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
          f.exception = (Exception *)(output->_builder).segment;
          pBVar14 = capnp::_::StructBuilder::getArena((StructBuilder *)&f);
          pCVar16 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&f);
          Input::consume(this_00,'[');
          psVar2 = &this->nestingDepth;
          uVar15 = this->nestingDepth + 1;
          this->nestingDepth = uVar15;
          f.exception = (Exception *)psVar2;
          if (this->maxNestingDepth < uVar15) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x2ad,FAILED,"++nestingDepth <= maxNestingDepth",
                       "_kjCondition,\"JSON message nested too deeply.\"",
                       (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
          }
          bVar12 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
            if (cVar13 == ']') break;
            capnp::_::OrphanBuilder::initStruct
                      ((OrphanBuilder *)&f,pBVar14,pCVar16,(StructSize)0x10002);
            pWStack_a0 = (WirePointer *)0x5;
            __kjCondition = (uint64_t)f.exception;
            capnp::_::OrphanBuilder::asStruct
                      ((StructBuilder *)&f,(OrphanBuilder *)&_kjCondition,(StructSize)0x10002);
            if (bVar12) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            parseValue(this,(Builder *)&f);
            if (fields.builder.pos == fields.builder.endPtr) {
              sVar18 = (long)fields.builder.pos - (long)fields.builder.ptr >> 4;
              if (fields.builder.pos == fields.builder.ptr) {
                sVar18 = 4;
              }
              kj::Vector<capnp::Orphan<capnp::json::Value>_>::setCapacity
                        ((Vector<capnp::Orphan<capnp::json::Value>_> *)&fields,sVar18);
            }
            ((fields.builder.pos)->builder).segment = (SegmentBuilder *)this;
            ((fields.builder.pos)->builder).capTable = (CapTableBuilder *)" <= ";
            ((fields.builder.pos)->builder).location = (word *)0x5;
            ((fields.builder.pos)->builder).tag.content = __kjCondition;
            fields.builder.pos = fields.builder.pos + 1;
            bVar12 = true;
          }
          *(undefined2 *)(output->_builder).data = 4;
          pWVar5 = (output->_builder).pointers;
          __kjCondition = (uint64_t)(output->_builder).segment;
          pCVar16 = (output->_builder).capTable;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)&f,(PointerBuilder *)&_kjCondition,
                     (ElementCount)
                     ((ulong)((long)fields.builder.pos - (long)fields.builder.ptr) >> 5),
                     (StructSize)0x10002);
          f.exception = (Exception *)(output->_builder).segment;
          capnp::_::PointerBuilder::getStructList
                    ((ListBuilder *)&_kjCondition_1,(PointerBuilder *)&f,(StructSize)0x10002,
                     (word *)0x0);
          lVar22 = (long)fields.builder.pos - (long)fields.builder.ptr;
          if (lVar22 != 0) {
            lVar20 = 0;
            lVar21 = 0;
            do {
              pOVar7 = fields.builder.ptr;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&f,(ListBuilder *)&_kjCondition_1,(ElementCount)lVar21);
              capnp::_::OrphanBuilder::asStruct
                        ((StructBuilder *)&_kjCondition,
                         (OrphanBuilder *)((long)&(pOVar7->builder).tag.content + lVar20),
                         (StructSize)0x0);
              other.capTable = pCVar16;
              other.segment = (SegmentBuilder *)__kjCondition;
              other.data = pWVar5;
              other.pointers = pWStack_a0;
              other._32_8_ = local_98;
              capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&f,other);
              lVar21 = lVar21 + 1;
              lVar20 = lVar20 + 0x20;
            } while (lVar22 >> 5 != lVar21);
          }
          Input::consume(this_00,']');
          pOVar9 = fields.builder.endPtr;
          pRVar8 = fields.builder.pos;
          pOVar7 = fields.builder.ptr;
          *psVar2 = *psVar2 - 1;
          if (fields.builder.ptr != (Orphan<capnp::json::Value::Field> *)0x0) {
            fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
            fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
            fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
            (**(fields.builder.disposer)->_vptr_ArrayDisposer)
                      (fields.builder.disposer,pOVar7,0x20,(long)pRVar8 - (long)pOVar7 >> 5,
                       (long)pOVar9 - (long)pOVar7 >> 5,
                       kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value>_>::destruct);
          }
        }
        else {
          if (bVar11 != 0x66) {
LAB_001742a1:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x298,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          expected.size_ = 5;
          expected.ptr = "false";
          Input::consume(this_00,expected);
          puVar4 = (undefined2 *)(output->_builder).data;
          *puVar4 = 1;
          pbVar1 = (byte *)(puVar4 + 1);
          *pbVar1 = *pbVar1 & 0xfe;
        }
      }
      else if (bVar11 == 0x6e) {
        expected_01.size_ = 4;
        expected_01.ptr = "null";
        Input::consume(this_00,expected_01);
        *(undefined2 *)(output->_builder).data = 0;
      }
      else if (bVar11 == 0x74) {
        expected_00.size_ = 4;
        expected_00.ptr = "true";
        Input::consume(this_00,expected_00);
        puVar4 = (undefined2 *)(output->_builder).data;
        *puVar4 = 1;
        pbVar1 = (byte *)(puVar4 + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        if (bVar11 != 0x7b) goto LAB_001742a1;
        fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
        fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
        fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
        fields.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        f.exception = (Exception *)(output->_builder).segment;
        pBVar14 = capnp::_::StructBuilder::getArena((StructBuilder *)&f);
        local_38 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&f);
        Input::consume(this_00,'{');
        f.exception = (Exception *)&this->nestingDepth;
        uVar15 = this->nestingDepth + 1;
        this->nestingDepth = uVar15;
        local_40 = (size_t *)f.exception;
        if (this->maxNestingDepth < uVar15) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x2d0,FAILED,"++nestingDepth <= maxNestingDepth",
                     "_kjCondition,\"JSON message nested too deeply.\"",
                     (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                     (char (*) [32])"JSON message nested too deeply.");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        bVar12 = false;
        while( true ) {
          Input::consumeWhitespace(this_00);
          cVar13 = Input::nextChar((Input *)(this->input).wrapped.ptr);
          if (cVar13 == '}') break;
          capnp::_::OrphanBuilder::initStruct
                    ((OrphanBuilder *)&f,pBVar14,local_38,(StructSize)0x20000);
          __kjCondition_1 = (uint64_t)f.exception;
          capnp::_::OrphanBuilder::asStruct
                    ((StructBuilder *)&f,(OrphanBuilder *)&_kjCondition_1,(StructSize)0x20000);
          if (bVar12) {
            Input::consumeWhitespace(this_00);
            Input::consume(this_00,',');
            Input::consumeWhitespace(this_00);
          }
          consumeQuotedString((String *)&local_58,this);
          pEVar17 = (Exception *)0x229f1b;
          if ((Parser *)local_58.capTable != (Parser *)0x0) {
            pEVar17 = (Exception *)local_58.segment;
          }
          value_00.super_StringPtr.content.size_ =
               (long)&(local_58.capTable)->super_CapTableReader +
               (ulong)((Parser *)local_58.capTable == (Parser *)0x0);
          __kjCondition = (uint64_t)f.exception;
          value_00.super_StringPtr.content.ptr = (char *)pEVar17;
          capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition,value_00);
          pCVar16 = local_58.capTable;
          pSVar10 = local_58.segment;
          if ((Exception *)local_58.segment != (Exception *)0x0) {
            local_58.segment = (SegmentBuilder *)0x0;
            local_58.capTable = (CapTableBuilder *)0x0;
            (**(code **)*local_58.pointer)(local_58.pointer,pSVar10,1,pCVar16,pCVar16,0);
          }
          Input::consumeWhitespace(this_00);
          Input::consume(this_00,':');
          Input::consumeWhitespace(this_00);
          local_58.pointer = (WirePointer *)0xd;
          local_58.segment = (SegmentBuilder *)f.exception;
          local_58.capTable = (CapTableBuilder *)this;
          capnp::_::PointerBuilder::getStruct
                    ((StructBuilder *)&_kjCondition,&local_58,(StructSize)0x10002,(word *)0x0);
          parseValue(this,(Builder *)&_kjCondition);
          if (fields.builder.pos == fields.builder.endPtr) {
            sVar18 = (long)fields.builder.pos - (long)fields.builder.ptr >> 4;
            if (fields.builder.pos == fields.builder.ptr) {
              sVar18 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::setCapacity(&fields,sVar18);
          }
          ((fields.builder.pos)->builder).segment = (SegmentBuilder *)this;
          ((fields.builder.pos)->builder).capTable = (CapTableBuilder *)" <= ";
          ((fields.builder.pos)->builder).location = (word *)0x5;
          ((fields.builder.pos)->builder).tag.content = __kjCondition_1;
          fields.builder.pos = fields.builder.pos + 1;
          bVar12 = true;
        }
        *(undefined2 *)(output->_builder).data = 5;
        pWVar5 = (output->_builder).pointers;
        __kjCondition = (uint64_t)(output->_builder).segment;
        pCVar16 = (output->_builder).capTable;
        capnp::_::PointerBuilder::initStructList
                  ((ListBuilder *)&f,(PointerBuilder *)&_kjCondition,
                   (ElementCount)((ulong)((long)fields.builder.pos - (long)fields.builder.ptr) >> 5)
                   ,(StructSize)0x20000);
        f.exception = (Exception *)(output->_builder).segment;
        capnp::_::PointerBuilder::getStructList
                  ((ListBuilder *)&_kjCondition_1,(PointerBuilder *)&f,(StructSize)0x20000,
                   (word *)0x0);
        lVar22 = (long)fields.builder.pos - (long)fields.builder.ptr;
        if (lVar22 != 0) {
          lVar20 = 0;
          lVar21 = 0;
          do {
            pOVar7 = fields.builder.ptr;
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&f,(ListBuilder *)&_kjCondition_1,(ElementCount)lVar21);
            capnp::_::OrphanBuilder::asStruct
                      ((StructBuilder *)&_kjCondition,
                       (OrphanBuilder *)((long)&(pOVar7->builder).tag.content + lVar20),
                       (StructSize)0x0);
            other_00.capTable = pCVar16;
            other_00.segment = (SegmentBuilder *)__kjCondition;
            other_00.data = pWVar5;
            other_00.pointers = pWStack_a0;
            other_00._32_8_ = local_98;
            capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&f,other_00);
            lVar21 = lVar21 + 1;
            lVar20 = lVar20 + 0x20;
          } while (lVar22 >> 5 != lVar21);
        }
        Input::consume(this_00,'}');
        pOVar9 = fields.builder.endPtr;
        pRVar8 = fields.builder.pos;
        pOVar7 = fields.builder.ptr;
        *local_40 = *local_40 - 1;
        if (fields.builder.ptr != (Orphan<capnp::json::Value::Field> *)0x0) {
          fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
          fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
          (**(fields.builder.disposer)->_vptr_ArrayDisposer)
                    (fields.builder.disposer,pOVar7,0x20,(long)pRVar8 - (long)pOVar7 >> 5,
                     (long)pOVar9 - (long)pOVar7 >> 5,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value::Field>_>::
                     destruct);
        }
      }
LAB_00173902:
      Input::consumeWhitespace(this_00);
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x28c,FAILED,"!input.exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
             &_kjCondition,(char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume("null"_kj);  output.setNull();         break;
      case 'f': input.consume("false"_kj); output.setBoolean(false); break;
      case 't': input.consume("true"_kj);  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }